

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_csv2xlsx.c
# Opt level: O1

int append_buffer_data(char **pdata,size_t *pdatalen,char *bufferdata,size_t bufferdatalen)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = (char *)realloc(*pdata,bufferdatalen + *pdatalen + 1);
  *pdata = pcVar1;
  if (pcVar1 == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = *pdatalen;
    memcpy(pcVar1 + sVar2,bufferdata,bufferdatalen);
    sVar2 = sVar2 + bufferdatalen;
  }
  *pdatalen = sVar2;
  return (uint)(pcVar1 == (char *)0x0);
}

Assistant:

int append_buffer_data (char** pdata, size_t* pdatalen, const char* bufferdata, size_t bufferdatalen)
{
  //allocate larger data buffer, abort in case of memory allocation error
  if ((*pdata = (char*)realloc(*pdata, *pdatalen + bufferdatalen + 1)) == NULL) {
    //memory allocation error
    *pdatalen = 0;
    return 1;
  }
  //append new data and adjust length
  memcpy(*pdata + *pdatalen, bufferdata, bufferdatalen);
  *pdatalen += bufferdatalen;
  return 0;
}